

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_EstimateFee_LargeAmount_MinBits36_Test::TestBody
          (ElementsTransactionApi_EstimateFee_LargeAmount_MinBits36_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  initializer_list<cfd::api::ElementsUtxoAndOption> __l_00;
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  size_type sVar4;
  size_t sVar5;
  ulong uVar6;
  Amount *expected_predicate_value;
  Amount AVar7;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  Amount tx_fee;
  Amount utxo_fee;
  Amount calc_fee;
  uint64_t effective_fee_rate2;
  double effective_fee_rate;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  ElementsUtxoAndOption eutxo3;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  Amount fee;
  ElementsConfidentialAddress asset_address;
  ElementsConfidentialAddress address;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  UtxoData *in_stack_ffffffffffffa5e8;
  undefined4 uVar8;
  ConfidentialTxOutReference *this_00;
  ElementsUtxoAndOption *in_stack_ffffffffffffa5f0;
  uint uVar9;
  ElementsUtxoAndOption *this_01;
  undefined4 in_stack_ffffffffffffa5f8;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffa5fc;
  ElementsUtxoAndOption *in_stack_ffffffffffffa600;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  ElementsUtxoAndOption *in_stack_ffffffffffffa608;
  undefined7 in_stack_ffffffffffffa610;
  undefined1 in_stack_ffffffffffffa617;
  allocator_type *in_stack_ffffffffffffa618;
  ConfidentialTransactionContext *in_stack_ffffffffffffa620;
  undefined4 in_stack_ffffffffffffa628;
  NetType in_stack_ffffffffffffa62c;
  ConfidentialTransactionContext *in_stack_ffffffffffffa630;
  undefined8 in_stack_ffffffffffffa638;
  undefined4 in_stack_ffffffffffffa640;
  undefined4 in_stack_ffffffffffffa644;
  ConfidentialAssetId *in_stack_ffffffffffffa648;
  undefined7 in_stack_ffffffffffffa650;
  undefined1 in_stack_ffffffffffffa657;
  undefined4 in_stack_ffffffffffffa658;
  undefined4 in_stack_ffffffffffffa65c;
  undefined4 in_stack_ffffffffffffa660;
  undefined4 in_stack_ffffffffffffa664;
  UtxoData *in_stack_ffffffffffffa668;
  undefined7 in_stack_ffffffffffffa670;
  undefined1 in_stack_ffffffffffffa677;
  int exponent;
  undefined8 in_stack_ffffffffffffa6a8;
  allocator *paVar11;
  int minimum_bits;
  undefined8 in_stack_ffffffffffffa6b0;
  undefined2 in_stack_ffffffffffffa6b8;
  undefined1 in_stack_ffffffffffffa6ba;
  undefined1 in_stack_ffffffffffffa6bb;
  undefined1 in_stack_ffffffffffffa6bc;
  undefined1 in_stack_ffffffffffffa6bd;
  undefined1 in_stack_ffffffffffffa6be;
  undefined1 in_stack_ffffffffffffa6bf;
  undefined8 in_stack_ffffffffffffa6c0;
  undefined1 uVar12;
  ConfidentialAssetId *in_stack_ffffffffffffa6c8;
  undefined2 in_stack_ffffffffffffa6d0;
  undefined1 in_stack_ffffffffffffa6d2;
  undefined1 in_stack_ffffffffffffa6d3;
  undefined1 in_stack_ffffffffffffa6d4;
  undefined1 in_stack_ffffffffffffa6d5;
  undefined1 in_stack_ffffffffffffa6d6;
  undefined1 in_stack_ffffffffffffa6d7;
  ElementsConfidentialAddress *in_stack_ffffffffffffa6d8;
  ConfidentialTransactionContext *in_stack_ffffffffffffa6e0;
  undefined8 **local_5868;
  undefined8 **local_5818;
  AssertHelper local_5758;
  Message local_5750;
  int64_t local_5748;
  AssertionResult local_5740;
  AssertHelper local_5730;
  Message local_5728;
  undefined4 local_571c;
  AssertionResult local_5718;
  uint local_5704;
  AssertHelper local_5700;
  Message local_56f8;
  undefined4 local_56f0;
  uint32_t local_56ec;
  AssertionResult local_56e8;
  AssertHelper local_56d8;
  Message local_56d0;
  undefined4 local_56c4;
  size_t local_56c0;
  AssertionResult local_56b8;
  AssertHelper local_56a8;
  Message local_56a0;
  ByteData local_5698;
  AssertHelper local_5680;
  Message local_5678;
  OutPoint local_5670;
  AssertHelper local_5648;
  Message local_5640;
  SigHashType local_5638;
  allocator local_5629;
  string local_5628;
  Privkey local_5608;
  allocator local_55e1;
  string local_55e0;
  Pubkey local_55c0;
  OutPoint local_55a8;
  AssertHelper local_5580;
  Message local_5578 [2];
  ByteData local_5568;
  byte local_5549;
  ConstCharPtr local_5548;
  AssertHelper local_5540;
  Message local_5538;
  OutPoint local_5530;
  AssertHelper local_5508;
  Message local_5500;
  SigHashType local_54f8;
  allocator local_54e9;
  string local_54e8;
  Privkey local_54c8;
  allocator local_54a1;
  string local_54a0;
  Pubkey local_5480;
  OutPoint local_5468;
  AssertHelper local_5440;
  undefined7 in_stack_ffffffffffffabc8;
  undefined1 in_stack_ffffffffffffabcf;
  ConfidentialTransactionContext *in_stack_ffffffffffffabd0;
  Privkey *in_stack_ffffffffffffabd8;
  Pubkey *in_stack_ffffffffffffabe0;
  OutPoint *in_stack_ffffffffffffabe8;
  undefined7 in_stack_ffffffffffffabf0;
  byte in_stack_ffffffffffffabf7;
  ConstCharPtr local_5408;
  AssertHelper in_stack_ffffffffffffac00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffac08;
  OutPoint local_53f0;
  AssertHelper local_53c8;
  Message local_53c0;
  SigHashType local_53b8;
  allocator local_53a9;
  string local_53a8;
  Privkey local_5388;
  allocator local_5361;
  string local_5360;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffacc8;
  ConfidentialTransactionContext *in_stack_ffffffffffffacd0;
  OutPoint local_5328;
  ByteData local_5300;
  string local_52e8;
  AssertHelper local_52c8;
  Message local_52c0;
  ConfidentialValue local_52b8;
  byte local_5289;
  AssertionResult local_5288;
  string local_5278;
  AssertHelper local_5258;
  Message local_5250;
  ConfidentialValue local_5248;
  undefined1 local_5219;
  AssertionResult local_5218;
  string local_5208;
  AssertHelper local_51e8;
  Message local_51e0;
  ConfidentialValue local_51d8;
  undefined1 local_51a9;
  AssertionResult local_51a8;
  AssertHelper local_5198;
  Message local_5190;
  undefined4 local_5184;
  size_type local_5180;
  AssertionResult local_5178;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_5168;
  AssertHelper local_5150;
  Message local_5148 [4];
  AssertHelper local_5128;
  Message local_5120;
  undefined4 local_5114;
  int64_t local_5110;
  AssertionResult local_5108;
  AssertHelper local_50f8;
  Message local_50f0;
  undefined4 local_50e4;
  int64_t local_50e0;
  AssertionResult local_50d8;
  AssertHelper local_50c8;
  Message local_50c0;
  undefined4 local_50b4;
  int64_t local_50b0;
  AssertionResult local_50a8;
  int64_t local_5098;
  undefined1 local_5090;
  string local_5088;
  int64_t local_5068;
  undefined1 local_5060;
  ElementsTransactionApi local_5051;
  Amount local_5050;
  Amount local_5040;
  Amount local_5030;
  undefined8 local_5020;
  undefined8 local_5018;
  undefined1 **local_5008;
  undefined8 *local_5000 [174];
  undefined1 local_4a90 [1392];
  undefined1 local_4520 [1392];
  undefined1 **local_3fb0;
  undefined8 local_3fa8;
  AssertHelper local_2f38;
  Message local_2f30 [2];
  undefined1 **local_2f20;
  undefined8 *local_2f18 [165];
  undefined1 local_29f0 [1320];
  undefined1 local_24c8 [1320];
  undefined1 **local_1fa0;
  undefined8 local_1f98;
  Address local_1f78;
  int64_t local_1df8;
  undefined1 local_1df0;
  int64_t local_1de8;
  undefined1 local_1de0;
  Amount local_1dd8;
  int64_t local_1dc8;
  undefined1 local_1dc0;
  OutPoint local_1db8;
  OutPoint local_1d90;
  AssertHelper local_1d68;
  Message local_1d60 [2];
  ConfidentialTransaction local_1d50 [3];
  Amount local_1c78;
  allocator local_1c61;
  string local_1c60;
  ElementsConfidentialAddress local_1c40;
  allocator local_1a81;
  string local_1a80;
  ElementsConfidentialAddress local_1a60;
  allocator local_18a1;
  string local_18a0;
  ConfidentialAssetId local_1880;
  Amount local_1858;
  allocator local_1841;
  string local_1840 [32];
  Address local_1820;
  allocator local_1699;
  string local_1698;
  Script local_1678;
  allocator local_1639;
  string local_1638;
  Txid local_1618;
  undefined8 local_15f8;
  Txid local_15d0;
  uint32_t local_15b0;
  Script local_15a8 [2];
  Address local_1538;
  string local_13b8 [32];
  Amount local_1398;
  undefined4 local_1388;
  undefined8 local_1380;
  ConfidentialAssetId local_1378 [17];
  allocator local_10c9;
  string local_10c8;
  ConfidentialValue local_10a8;
  allocator local_1079;
  string local_1078;
  BlindFactor local_1058;
  allocator local_1031;
  string local_1030;
  BlindFactor local_1010;
  allocator local_fe9;
  string local_fe8;
  ConfidentialAssetId local_fc8;
  Amount local_fa0;
  allocator local_f89;
  string local_f88 [32];
  Address local_f68;
  allocator local_de1;
  string local_de0;
  Script local_dc0;
  allocator local_d81;
  string local_d80;
  Txid local_d60;
  undefined8 local_d40;
  Txid local_d18;
  uint32_t local_cf8;
  Script local_cf0 [2];
  Address local_c80;
  string local_b00 [32];
  int64_t local_ae0;
  undefined1 local_ad8;
  undefined4 local_ad0;
  undefined8 local_ac8;
  ConfidentialAssetId local_ac0 [12];
  BlindFactor local_8e0;
  BlindFactor local_8c0;
  ConfidentialValue local_8a0 [3];
  allocator local_811;
  string local_810;
  ConfidentialAssetId local_7f0;
  Amount local_7c8;
  allocator local_7b1;
  string local_7b0 [32];
  Address local_790;
  allocator local_609;
  string local_608;
  Script local_5e8;
  allocator local_5a9;
  string local_5a8;
  Txid local_588;
  undefined8 local_558;
  Txid local_530;
  uint32_t local_510;
  Script local_508 [2];
  Address local_498;
  string local_318 [32];
  Amount local_2f8;
  undefined4 local_2e8;
  undefined8 local_2e0;
  ConfidentialAssetId local_2d8 [18];
  
  uVar12 = (undefined1)((ulong)in_stack_ffffffffffffa6c0 >> 0x38);
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)in_stack_ffffffffffffa630,in_stack_ffffffffffffa62c);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa664,in_stack_ffffffffffffa660))
  ;
  local_558 = 0;
  local_2e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_5a9);
  cfd::core::Txid::Txid(&local_588,&local_5a8);
  cfd::core::Txid::operator=(&local_530,&local_588);
  cfd::core::Txid::~Txid((Txid *)0x2cefb6);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  local_510 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_609);
  cfd::core::Script::Script(&local_5e8,&local_608);
  cfd::core::Script::operator=(local_508,&local_5e8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffa5f0);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_7b1);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffa5fc,in_stack_ffffffffffffa5f8),
             (string *)in_stack_ffffffffffffa5f0);
  cfd::core::Address::operator=(&local_498,&local_790);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffa5f0);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::__cxx11::string::operator=
            (local_318,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_7c8,100000000000000);
  local_2f8.ignore_check_ = local_7c8.ignore_check_;
  local_2f8.amount_ = local_7c8.amount_;
  local_2e8 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_810,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_811);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7f0,&local_810);
  cfd::core::ConfidentialAssetId::operator=(local_2d8,&local_7f0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2cf1b9);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa664,in_stack_ffffffffffffa660))
  ;
  local_d40 = 0;
  local_ac8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d80,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_d81);
  cfd::core::Txid::Txid(&local_d60,&local_d80);
  cfd::core::Txid::operator=(&local_d18,&local_d60);
  cfd::core::Txid::~Txid((Txid *)0x2cf268);
  std::__cxx11::string::~string((string *)&local_d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  local_cf8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_de0,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_de1);
  cfd::core::Script::Script(&local_dc0,&local_de0);
  cfd::core::Script::operator=(local_cf0,&local_dc0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffa5f0);
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator((allocator<char> *)&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f88,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",&local_f89);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffa5fc,in_stack_ffffffffffffa5f8),
             (string *)in_stack_ffffffffffffa5f0);
  cfd::core::Address::operator=(&local_c80,&local_f68);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffa5f0);
  std::__cxx11::string::~string(local_f88);
  std::allocator<char>::~allocator((allocator<char> *)&local_f89);
  std::__cxx11::string::operator=
            (local_b00,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_fa0,18000000000000);
  local_ad8 = local_fa0.ignore_check_;
  local_ae0 = local_fa0.amount_;
  local_ad0 = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_fe8,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735"
             ,&local_fe9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_fc8,&local_fe8);
  cfd::core::ConfidentialAssetId::operator=(local_ac0,&local_fc8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2cf46b);
  std::__cxx11::string::~string((string *)&local_fe8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1030,
             "23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e",&local_1031);
  cfd::core::BlindFactor::BlindFactor(&local_1010,&local_1030);
  cfd::core::BlindFactor::operator=(&local_8e0,&local_1010);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x2cf4f3);
  std::__cxx11::string::~string((string *)&local_1030);
  std::allocator<char>::~allocator((allocator<char> *)&local_1031);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1078,
             "6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc",&local_1079);
  cfd::core::BlindFactor::BlindFactor(&local_1058,&local_1078);
  cfd::core::BlindFactor::operator=(&local_8c0,&local_1058);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x2cf57b);
  std::__cxx11::string::~string((string *)&local_1078);
  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_10c8,
             "09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa",&local_10c9);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_10a8,&local_10c8);
  cfd::core::ConfidentialValue::operator=(local_8a0,&local_10a8);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2cf603);
  std::__cxx11::string::~string((string *)&local_10c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa664,in_stack_ffffffffffffa660))
  ;
  local_15f8 = 0;
  local_1380 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1638,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_1639);
  cfd::core::Txid::Txid(&local_1618,&local_1638);
  cfd::core::Txid::operator=(&local_15d0,&local_1618);
  cfd::core::Txid::~Txid((Txid *)0x2cf6b2);
  std::__cxx11::string::~string((string *)&local_1638);
  std::allocator<char>::~allocator((allocator<char> *)&local_1639);
  local_15b0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1698,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_1699);
  cfd::core::Script::Script(&local_1678,&local_1698);
  cfd::core::Script::operator=(local_15a8,&local_1678);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffa5f0);
  std::__cxx11::string::~string((string *)&local_1698);
  std::allocator<char>::~allocator((allocator<char> *)&local_1699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1840,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_1841)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffa5fc,in_stack_ffffffffffffa5f8),
             (string *)in_stack_ffffffffffffa5f0);
  cfd::core::Address::operator=(&local_1538,&local_1820);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffa5f0);
  std::__cxx11::string::~string(local_1840);
  std::allocator<char>::~allocator((allocator<char> *)&local_1841);
  std::__cxx11::string::operator=
            (local_13b8,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_1858,100000000000000);
  local_1398.ignore_check_ = local_1858.ignore_check_;
  local_1398.amount_ = local_1858.amount_;
  local_1388 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_18a0,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_18a1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1880,&local_18a0);
  cfd::core::ConfidentialAssetId::operator=(local_1378,&local_1880);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2cf8b5);
  std::__cxx11::string::~string((string *)&local_18a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a80,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz",
             &local_1a81);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_1a60,&local_1a80);
  std::__cxx11::string::~string((string *)&local_1a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c60,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS",
             &local_1c61);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_1c40,&local_1c60);
  std::__cxx11::string::~string((string *)&local_1c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c61);
  cfd::core::Amount::Amount(&local_1c78,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_ffffffffffffa620,(uint32_t)((ulong)in_stack_ffffffffffffa618 >> 0x20),
             (uint32_t)in_stack_ffffffffffffa618);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::AddInput
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffa600,
                 (UtxoData *)CONCAT44(in_stack_ffffffffffffa5fc,in_stack_ffffffffffffa5f8));
    }
  }
  else {
    testing::Message::Message(local_1d60);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x160,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1d68,local_1d60);
    testing::internal::AssertHelper::~AssertHelper(&local_1d68);
    testing::Message::~Message((Message *)0x2d023a);
  }
  cfd::core::OutPoint::OutPoint(&local_1d90,&local_d18,local_cf8);
  cfd::ConfidentialTransactionContext::AddTxIn
            (in_stack_ffffffffffffa630,
             (OutPoint *)CONCAT44(in_stack_ffffffffffffa62c,in_stack_ffffffffffffa628));
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d02c7);
  cfd::core::OutPoint::OutPoint(&local_1db8,&local_15d0,local_15b0);
  cfd::ConfidentialTransactionContext::AddTxIn
            (in_stack_ffffffffffffa630,
             (OutPoint *)CONCAT44(in_stack_ffffffffffffa62c,in_stack_ffffffffffffa628));
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d0309);
  AVar7 = cfd::core::operator+(&local_2f8,&local_1398);
  local_1de8 = AVar7.amount_;
  local_1de0 = AVar7.ignore_check_;
  local_1dd8.amount_ = local_1de8;
  local_1dd8.ignore_check_ = (bool)local_1de0;
  AVar7 = cfd::core::operator-(&local_1dd8,&local_1c78);
  local_1df8 = AVar7.amount_;
  local_1df0 = AVar7.ignore_check_;
  local_1dc8 = local_1df8;
  local_1dc0 = local_1df0;
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffa6e0,in_stack_ffffffffffffa6d8,
             (Amount *)
             CONCAT17(in_stack_ffffffffffffa6d7,
                      CONCAT16(in_stack_ffffffffffffa6d6,
                               CONCAT15(in_stack_ffffffffffffa6d5,
                                        CONCAT14(in_stack_ffffffffffffa6d4,
                                                 CONCAT13(in_stack_ffffffffffffa6d3,
                                                          CONCAT12(in_stack_ffffffffffffa6d2,
                                                                   in_stack_ffffffffffffa6d0)))))),
             in_stack_ffffffffffffa6c8,(bool)uVar12);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&local_1f78,&local_1c40);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffa664,in_stack_ffffffffffffa660),
             (Address *)CONCAT44(in_stack_ffffffffffffa65c,in_stack_ffffffffffffa658),
             (Amount *)CONCAT17(in_stack_ffffffffffffa657,in_stack_ffffffffffffa650),
             in_stack_ffffffffffffa648);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffa5f0);
  cfd::core::ConfidentialTransaction::AddTxOutFee(local_1d50,&local_1c78,local_2d8);
  local_2f20 = (undefined1 **)local_2f18;
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffa677,in_stack_ffffffffffffa670),
             in_stack_ffffffffffffa668);
  local_2f20 = (undefined1 **)local_29f0;
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffa677,in_stack_ffffffffffffa670),
             in_stack_ffffffffffffa668);
  local_2f20 = (undefined1 **)local_24c8;
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffa677,in_stack_ffffffffffffa670),
             in_stack_ffffffffffffa668);
  local_1fa0 = (undefined1 **)local_2f18;
  local_1f98 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2d04ef);
  __l._M_array._4_4_ = in_stack_ffffffffffffa62c;
  __l._M_array._0_4_ = in_stack_ffffffffffffa628;
  __l._M_len = (size_type)in_stack_ffffffffffffa630;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffa620,__l,
             (allocator_type *)in_stack_ffffffffffffa618);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2d0523);
  local_5818 = &local_1fa0;
  do {
    local_5818 = local_5818 + -0xa5;
    cfd::UtxoData::~UtxoData(&in_stack_ffffffffffffa5f0->utxo);
  } while (local_5818 != local_2f18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffacd0,in_stack_ffffffffffffacc8);
    }
  }
  else {
    testing::Message::Message(local_2f30);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x168,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2f38,local_2f30);
    testing::internal::AssertHelper::~AssertHelper(&local_2f38);
    testing::Message::~Message((Message *)0x2d07ee);
  }
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa600);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa600);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa600);
  cfd::UtxoData::operator=(&in_stack_ffffffffffffa5f0->utxo,in_stack_ffffffffffffa5e8);
  cfd::UtxoData::operator=(&in_stack_ffffffffffffa5f0->utxo,in_stack_ffffffffffffa5e8);
  cfd::UtxoData::operator=(&in_stack_ffffffffffffa5f0->utxo,in_stack_ffffffffffffa5e8);
  local_5008 = (undefined1 **)local_5000;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT17(in_stack_ffffffffffffa617,in_stack_ffffffffffffa610),
             in_stack_ffffffffffffa608);
  local_5008 = (undefined1 **)local_4a90;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT17(in_stack_ffffffffffffa617,in_stack_ffffffffffffa610),
             in_stack_ffffffffffffa608);
  local_5008 = (undefined1 **)local_4520;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT17(in_stack_ffffffffffffa617,in_stack_ffffffffffffa610),
             in_stack_ffffffffffffa608);
  local_3fb0 = (undefined1 **)local_5000;
  local_3fa8 = 3;
  std::allocator<cfd::api::ElementsUtxoAndOption>::allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2d0939);
  __l_00._M_array._4_4_ = in_stack_ffffffffffffa62c;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffa628;
  __l_00._M_len = (size_type)in_stack_ffffffffffffa630;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)in_stack_ffffffffffffa620,__l_00,in_stack_ffffffffffffa618);
  std::allocator<cfd::api::ElementsUtxoAndOption>::~allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2d096d);
  local_5868 = &local_3fb0;
  do {
    local_5868 = local_5868 + -0xae;
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(in_stack_ffffffffffffa5f0);
    minimum_bits = (int)in_stack_ffffffffffffa6b0;
    exponent = (int)in_stack_ffffffffffffa6a8;
    uVar12 = (undefined1)((ulong)in_stack_ffffffffffffa638 >> 0x38);
    uVar8 = (undefined4)((ulong)in_stack_ffffffffffffa5e8 >> 0x20);
  } while (local_5868 != local_5000);
  local_5018 = 0x3fb999999999999a;
  local_5020 = 100;
  cfd::core::Amount::Amount(&local_5030);
  uVar9 = (uint)((ulong)in_stack_ffffffffffffa5f0 >> 0x20);
  cfd::core::Amount::Amount(&local_5040);
  cfd::core::Amount::Amount(&local_5050);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_5051);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_5088,&local_1d50[0].super_AbstractTransaction);
  this_02 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
  uVar10 = 0x24;
  this_01 = (ElementsUtxoAndOption *)((ulong)uVar9 << 0x20);
  this_00 = (ConfidentialTxOutReference *)CONCAT44(uVar8,1);
  expected_predicate_value = &local_5040;
  AVar7 = cfd::api::ElementsTransactionApi::EstimateFee
                    ((ElementsTransactionApi *)in_stack_ffffffffffffa668,
                     (string *)CONCAT44(in_stack_ffffffffffffa664,in_stack_ffffffffffffa660),
                     (vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                      *)CONCAT44(in_stack_ffffffffffffa65c,in_stack_ffffffffffffa658),
                     (ConfidentialAssetId *)
                     CONCAT17(in_stack_ffffffffffffa657,in_stack_ffffffffffffa650),
                     (Amount *)in_stack_ffffffffffffa648,
                     (Amount *)CONCAT44(in_stack_ffffffffffffa644,in_stack_ffffffffffffa640),
                     (bool)uVar12,(double)in_stack_ffffffffffffa630,exponent,minimum_bits,
                     (uint32_t *)
                     CONCAT17(in_stack_ffffffffffffa6bf,
                              CONCAT16(in_stack_ffffffffffffa6be,
                                       CONCAT15(in_stack_ffffffffffffa6bd,
                                                CONCAT14(in_stack_ffffffffffffa6bc,
                                                         CONCAT13(in_stack_ffffffffffffa6bb,
                                                                  CONCAT12(in_stack_ffffffffffffa6ba
                                                                           ,
                                                  in_stack_ffffffffffffa6b8)))))));
  local_5098 = AVar7.amount_;
  local_5090 = AVar7.ignore_check_;
  local_5068 = local_5098;
  local_5060 = local_5090;
  local_5030.amount_ = local_5098;
  local_5030.ignore_check_ = (bool)local_5090;
  std::__cxx11::string::~string((string *)&local_5088);
  local_50b0 = cfd::core::Amount::GetSatoshiValue(&local_5030);
  local_50b4 = 0x100;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa608,(char *)this_02,
             (long *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10),(int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50a8);
  if (!bVar1) {
    testing::Message::Message(&local_50c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2d0d3f);
    testing::internal::AssertHelper::AssertHelper
              (&local_50c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50c8,&local_50c0);
    testing::internal::AssertHelper::~AssertHelper(&local_50c8);
    testing::Message::~Message((Message *)0x2d0da2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d0dfa);
  local_50e0 = cfd::core::Amount::GetSatoshiValue(&local_5050);
  local_50e4 = 0xe1;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa608,(char *)this_02,
             (long *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10),(int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50d8);
  if (!bVar1) {
    testing::Message::Message(&local_50f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2d0ec8);
    testing::internal::AssertHelper::AssertHelper
              (&local_50f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50f8,&local_50f0);
    testing::internal::AssertHelper::~AssertHelper(&local_50f8);
    testing::Message::~Message((Message *)0x2d0f2b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d0f83);
  local_5110 = cfd::core::Amount::GetSatoshiValue(&local_5040);
  local_5114 = 0x20;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa608,(char *)this_02,
             (long *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10),(int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5108);
  if (!bVar1) {
    testing::Message::Message(&local_5120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2d1051);
    testing::internal::AssertHelper::AssertHelper
              (&local_5128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5128,&local_5120);
    testing::internal::AssertHelper::~AssertHelper(&local_5128);
    testing::Message::~Message((Message *)0x2d10b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d110c);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x2d1121);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      expected_predicate_value = (Amount *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                ((ConfidentialTransactionContext *)
                 CONCAT44(in_stack_ffffffffffffa664,in_stack_ffffffffffffa660),
                 (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                  *)CONCAT44(in_stack_ffffffffffffa65c,in_stack_ffffffffffffa658),
                 CONCAT17(in_stack_ffffffffffffa657,in_stack_ffffffffffffa650),
                 (int)((ulong)in_stack_ffffffffffffa648 >> 0x20),(int)in_stack_ffffffffffffa648,
                 (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)
                 CONCAT44(in_stack_ffffffffffffa644,in_stack_ffffffffffffa640));
    }
  }
  else {
    testing::Message::Message(local_5148);
    testing::internal::AssertHelper::AssertHelper
              (&local_5150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x183,
               "Expected: txc.Blind(&ct_addrs, 1, 0, 36) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5150,local_5148);
    testing::internal::AssertHelper::~AssertHelper(&local_5150);
    testing::Message::~Message((Message *)0x2d126d);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList(&local_5168,local_1d50);
  local_5180 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::size(&local_5168);
  local_5184 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)in_stack_ffffffffffffa608,(char *)this_02,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10),(int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5178);
  if (!bVar1) {
    testing::Message::Message(&local_5190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2d1392);
    testing::internal::AssertHelper::AssertHelper
              (&local_5198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x185,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5198,&local_5190);
    testing::internal::AssertHelper::~AssertHelper(&local_5198);
    testing::Message::~Message((Message *)0x2d13f5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d144d);
  sVar4 = std::
          vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
          ::size(&local_5168);
  if (sVar4 == 3) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_5168,0);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(this_00);
    local_51a9 = cfd::core::ConfidentialValue::HasBlinding(&local_51d8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_01,(bool *)this_00,(type *)0x2d14c6);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2d14d5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_51a8);
    if (!bVar1) {
      testing::Message::Message(&local_51e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_5208,(internal *)&local_51a8,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_51e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x187,pcVar3);
      testing::internal::AssertHelper::operator=(&local_51e8,&local_51e0);
      testing::internal::AssertHelper::~AssertHelper(&local_51e8);
      std::__cxx11::string::~string((string *)&local_5208);
      testing::Message::~Message((Message *)0x2d15f7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d1672);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_5168,1);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(this_00);
    local_5219 = cfd::core::ConfidentialValue::HasBlinding(&local_5248);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_01,(bool *)this_00,(type *)0x2d16d5);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2d16e4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5218);
    if (!bVar1) {
      testing::Message::Message(&local_5250);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_5278,(internal *)&local_5218,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x188,pcVar3);
      testing::internal::AssertHelper::operator=(&local_5258,&local_5250);
      testing::internal::AssertHelper::~AssertHelper(&local_5258);
      std::__cxx11::string::~string((string *)&local_5278);
      testing::Message::~Message((Message *)0x2d1806);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d1881);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_5168,2);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(this_00);
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_52b8);
    local_5289 = ~bVar1 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_01,(bool *)this_00,(type *)0x2d18e6);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2d18f5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5288);
    if (!bVar1) {
      testing::Message::Message(&local_52c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_52e8,(internal *)&local_5288,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 (char *)expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_52c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x189,pcVar3);
      testing::internal::AssertHelper::operator=(&local_52c8,&local_52c0);
      testing::internal::AssertHelper::~AssertHelper(&local_52c8);
      std::__cxx11::string::~string((string *)&local_52e8);
      testing::Message::~Message((Message *)0x2d1a17);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d1a8f);
  }
  cfd::core::ByteData::ByteData(&local_5300);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5328,&local_530,local_510);
      paVar11 = &local_5361;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5360,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",paVar11);
      cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffacc0,&local_5360);
      paVar11 = &local_53a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_53a8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 paVar11);
      cfd::core::Privkey::FromWif(&local_5388,&local_53a8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_53b8);
      this_01 = (ElementsUtxoAndOption *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)
                 CONCAT17(in_stack_ffffffffffffabf7,in_stack_ffffffffffffabf0),
                 in_stack_ffffffffffffabe8,in_stack_ffffffffffffabe0,in_stack_ffffffffffffabd8,
                 (SigHashType *)in_stack_ffffffffffffabd0,(bool)in_stack_ffffffffffffabcf,
                 (ByteData256 *)in_stack_ffffffffffffac00.data_,
                 (ByteData *)in_stack_ffffffffffffac08.ptr_);
      cfd::core::Privkey::~Privkey((Privkey *)0x2d1c0a);
      std::__cxx11::string::~string((string *)&local_53a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_53a9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d1c31);
      std::__cxx11::string::~string((string *)&local_5360);
      std::allocator<char>::~allocator((allocator<char> *)&local_5361);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d1c58);
    }
  }
  else {
    testing::Message::Message(&local_53c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_53c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x191,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_53c8,&local_53c0);
    testing::internal::AssertHelper::~AssertHelper(&local_53c8);
    testing::Message::~Message((Message *)0x2d1dea);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_53f0,&local_530,local_510);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffabd0,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffabcf,in_stack_ffffffffffffabc8));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d1eb3);
    }
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffac08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffac00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x192,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffac00,(Message *)&stack0xffffffffffffac08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffac00);
    testing::Message::~Message((Message *)0x2d1f7d);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_5408,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_5408);
  if (bVar1) {
    in_stack_ffffffffffffabf7 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10));
      cfd::core::ByteData::operator=(&local_5300,(ByteData *)&stack0xffffffffffffabd8);
      cfd::core::ByteData::~ByteData((ByteData *)0x2d2065);
    }
    if ((in_stack_ffffffffffffabf7 & 1) == 0) {
      local_5408.value =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002d212b;
    }
  }
  else {
LAB_002d212b:
    testing::Message::Message((Message *)&stack0xffffffffffffabc8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x194,local_5408.value);
    testing::internal::AssertHelper::operator=(&local_5440,(Message *)&stack0xffffffffffffabc8);
    testing::internal::AssertHelper::~AssertHelper(&local_5440);
    testing::Message::~Message((Message *)0x2d2193);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5468,&local_d18,local_cf8);
      paVar11 = &local_54a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_54a0,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",paVar11);
      cfd::core::Pubkey::Pubkey(&local_5480,&local_54a0);
      paVar11 = &local_54e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_54e8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 paVar11);
      cfd::core::Privkey::FromWif(&local_54c8,&local_54e8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_54f8);
      this_01 = (ElementsUtxoAndOption *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)
                 CONCAT17(in_stack_ffffffffffffabf7,in_stack_ffffffffffffabf0),
                 in_stack_ffffffffffffabe8,in_stack_ffffffffffffabe0,in_stack_ffffffffffffabd8,
                 (SigHashType *)in_stack_ffffffffffffabd0,(bool)in_stack_ffffffffffffabcf,
                 (ByteData256 *)in_stack_ffffffffffffac00.data_,
                 (ByteData *)in_stack_ffffffffffffac08.ptr_);
      cfd::core::Privkey::~Privkey((Privkey *)0x2d2336);
      std::__cxx11::string::~string((string *)&local_54e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_54e9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d235d);
      std::__cxx11::string::~string((string *)&local_54a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_54a1);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d2384);
    }
  }
  else {
    testing::Message::Message(&local_5500);
    testing::internal::AssertHelper::AssertHelper
              (&local_5508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x199,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5508,&local_5500);
    testing::internal::AssertHelper::~AssertHelper(&local_5508);
    testing::Message::~Message((Message *)0x2d24fd);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5530,&local_d18,local_cf8);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffabd0,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffabcf,in_stack_ffffffffffffabc8));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d25c6);
    }
  }
  else {
    testing::Message::Message(&local_5538);
    testing::internal::AssertHelper::AssertHelper
              (&local_5540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x19a,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5540,&local_5538);
    testing::internal::AssertHelper::~AssertHelper(&local_5540);
    testing::Message::~Message((Message *)0x2d2690);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_5548,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_5548);
  if (bVar1) {
    local_5549 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10));
      cfd::core::ByteData::operator=(&local_5300,&local_5568);
      cfd::core::ByteData::~ByteData((ByteData *)0x2d2778);
    }
    if ((local_5549 & 1) != 0) goto LAB_002d28f1;
    local_5548.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_5578);
  testing::internal::AssertHelper::AssertHelper
            (&local_5580,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x19c,local_5548.value);
  testing::internal::AssertHelper::operator=(&local_5580,local_5578);
  testing::internal::AssertHelper::~AssertHelper(&local_5580);
  testing::Message::~Message((Message *)0x2d28a6);
LAB_002d28f1:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_55a8,&local_15d0,local_15b0);
      paVar11 = &local_55e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_55e0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",paVar11);
      cfd::core::Pubkey::Pubkey(&local_55c0,&local_55e0);
      paVar11 = &local_5629;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5628,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 paVar11);
      cfd::core::Privkey::FromWif(&local_5608,&local_5628,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_5638);
      this_01 = (ElementsUtxoAndOption *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)
                 CONCAT17(in_stack_ffffffffffffabf7,in_stack_ffffffffffffabf0),
                 in_stack_ffffffffffffabe8,in_stack_ffffffffffffabe0,in_stack_ffffffffffffabd8,
                 (SigHashType *)in_stack_ffffffffffffabd0,(bool)in_stack_ffffffffffffabcf,
                 (ByteData256 *)in_stack_ffffffffffffac00.data_,
                 (ByteData *)in_stack_ffffffffffffac08.ptr_);
      cfd::core::Privkey::~Privkey((Privkey *)0x2d2a49);
      std::__cxx11::string::~string((string *)&local_5628);
      std::allocator<char>::~allocator((allocator<char> *)&local_5629);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d2a70);
      std::__cxx11::string::~string((string *)&local_55e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_55e1);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d2a97);
    }
  }
  else {
    testing::Message::Message(&local_5640);
    testing::internal::AssertHelper::AssertHelper
              (&local_5648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a1,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5648,&local_5640);
    testing::internal::AssertHelper::~AssertHelper(&local_5648);
    testing::Message::~Message((Message *)0x2d2c10);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5670,&local_15d0,local_15b0);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffabd0,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffabcf,in_stack_ffffffffffffabc8));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d2cd9);
    }
  }
  else {
    testing::Message::Message(&local_5678);
    testing::internal::AssertHelper::AssertHelper
              (&local_5680,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a2,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5680,&local_5678);
    testing::internal::AssertHelper::~AssertHelper(&local_5680);
    testing::Message::~Message((Message *)0x2d2da3);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10));
      cfd::core::ByteData::operator=(&local_5300,&local_5698);
      cfd::core::ByteData::~ByteData((ByteData *)0x2d2e65);
    }
  }
  else {
    testing::Message::Message(&local_56a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_56a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a4,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_56a8,&local_56a0);
    testing::internal::AssertHelper::~AssertHelper(&local_56a8);
    testing::Message::~Message((Message *)0x2d2f2f);
  }
  sVar5 = cfd::core::ByteData::GetDataSize(&local_5300);
  if ((((sVar5 != 0x2155) &&
       (sVar5 = cfd::core::ByteData::GetDataSize(&local_5300), sVar5 != 0x2156)) &&
      (sVar5 = cfd::core::ByteData::GetDataSize(&local_5300), sVar5 != 0x2157)) &&
     (sVar5 = cfd::core::ByteData::GetDataSize(&local_5300), sVar5 != 0x2158)) {
    local_56c0 = cfd::core::ByteData::GetDataSize(&local_5300);
    local_56c4 = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((char *)in_stack_ffffffffffffa608,(char *)this_02,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10),(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_56b8);
    if (!bVar1) {
      testing::Message::Message(&local_56d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2d30e2);
      testing::internal::AssertHelper::AssertHelper
                (&local_56d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1a8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_56d8,&local_56d0);
      testing::internal::AssertHelper::~AssertHelper(&local_56d8);
      testing::Message::~Message((Message *)0x2d3145);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d319a);
  }
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(local_1d50);
  if (((uVar2 != 0x9f7) &&
      (uVar2 = cfd::core::ConfidentialTransaction::GetVsize(local_1d50), uVar2 != 0x9f8)) &&
     (uVar2 = cfd::core::ConfidentialTransaction::GetVsize(local_1d50), uVar2 != 0x9f9)) {
    local_56ec = cfd::core::ConfidentialTransaction::GetVsize(local_1d50);
    local_56f0 = 0x9f8;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)in_stack_ffffffffffffa608,(char *)this_02,
               (uint *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10),(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_56e8);
    if (!bVar1) {
      testing::Message::Message(&local_56f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2d32c1);
      testing::internal::AssertHelper::AssertHelper
                (&local_5700,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1ac,pcVar3);
      testing::internal::AssertHelper::operator=(&local_5700,&local_56f8);
      testing::internal::AssertHelper::~AssertHelper(&local_5700);
      testing::Message::~Message((Message *)0x2d331e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d3373);
  }
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(local_1d50);
  local_5704 = (uVar2 * (int)local_5020) / 1000;
  local_571c = 0xff;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)in_stack_ffffffffffffa608,(char *)this_02,
             (uint *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10),(int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5718);
  if (!bVar1) {
    testing::Message::Message(&local_5728);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2d3449);
    testing::internal::AssertHelper::AssertHelper
              (&local_5730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1b0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5730,&local_5728);
    testing::internal::AssertHelper::~AssertHelper(&local_5730);
    testing::Message::~Message((Message *)0x2d34a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d34fe);
  uVar6 = cfd::core::Amount::GetSatoshiValue(&local_5030);
  if (((uVar6 != local_5704) &&
      (uVar6 = cfd::core::Amount::GetSatoshiValue(&local_5030), uVar6 != local_5704 + 1)) &&
     (uVar6 = cfd::core::Amount::GetSatoshiValue(&local_5030), uVar6 != local_5704 + 2)) {
    local_5748 = cfd::core::Amount::GetSatoshiValue(&local_5030);
    testing::internal::EqHelper<false>::Compare<long,unsigned_int>
              ((char *)in_stack_ffffffffffffa608,(char *)this_02,
               (long *)CONCAT44(in_stack_ffffffffffffa5fc,uVar10),(uint *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5740);
    if (!bVar1) {
      testing::Message::Message(&local_5750);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2d363a);
      testing::internal::AssertHelper::AssertHelper
                (&local_5758,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1b4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_5758,&local_5750);
      testing::internal::AssertHelper::~AssertHelper(&local_5758);
      testing::Message::~Message((Message *)0x2d3697);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d36ec);
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x2d370d);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)this_02);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_02);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(this_01);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(this_01);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(this_01);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::UtxoData::~UtxoData(&this_01->utxo);
  cfd::UtxoData::~UtxoData(&this_01->utxo);
  cfd::UtxoData::~UtxoData(&this_01->utxo);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2d37c3);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_LargeAmount_MinBits36)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{100000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{18000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{100000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxIn(OutPoint(utxo3.txid, utxo3.vout));
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ElementsUtxoAndOption eutxo1;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo3;
  eutxo1.utxo = utxo1;
  eutxo2.utxo = utxo2;
  eutxo3.utxo = utxo3;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1, eutxo2, eutxo3
  };

  // check estimateFee
  double effective_fee_rate = 0.1;
  uint64_t effective_fee_rate2 = 100;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, true, effective_fee_rate, 0, 36);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 256);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 225);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 32);

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs, 1, 0, 36));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 8533) && (tx.GetDataSize() != 8534) &&
      (tx.GetDataSize() != 8535) && (tx.GetDataSize() != 8536)) {
    EXPECT_EQ(tx.GetDataSize(), 0);
  }

  if ((txc.GetVsize() != 2551) && (txc.GetVsize() != 2552) && (txc.GetVsize() != 2553)) {
    EXPECT_EQ(txc.GetVsize(), 2552);
  }

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate2) / 1000;
  EXPECT_EQ(minimum_fee, 255);
  if ((calc_fee.GetSatoshiValue() != minimum_fee) &&
      (calc_fee.GetSatoshiValue() != (minimum_fee + 1)) &&
      (calc_fee.GetSatoshiValue() != (minimum_fee + 2))) {
    EXPECT_EQ(calc_fee.GetSatoshiValue(), minimum_fee);
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");
}